

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

int __thiscall embree::XMLWriter::open(XMLWriter *this,char *__file,int __oflag,...)

{
  ostream *poVar1;
  string *in_RCX;
  
  tab(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"<");
  poVar1 = std::operator<<(poVar1,(string *)__file);
  poVar1 = std::operator<<(poVar1," id=\"");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\" name=\"");
  poVar1 = std::operator<<(poVar1,in_RCX);
  poVar1 = std::operator<<(poVar1,"\">");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  this->ident = this->ident + 2;
  return (int)poVar1;
}

Assistant:

void XMLWriter::open(std::string str, size_t id, std::string name)
  {
    tab(); xml << "<" << str << " id=\"" << id << "\" name=\"" << name << "\">" << std::endl;
    ident+=2;
  }